

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O2

void __thiscall docs::DocsParser::createDoc(DocsParser *this,Doc *doc)

{
  Token *this_00;
  TokenKind TVar1;
  LexData *pLVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  Token *pTVar6;
  char cVar7;
  Token id_tok;
  string type;
  Token commentTok;
  pointer local_b8 [17];
  
  this_00 = &this->tok;
switchD_0010722d_caseD_5:
  while( true ) {
    do {
      pTVar6 = next_token(this);
      if (pTVar6->kind == Eof) {
        return;
      }
    } while (this_00->kind != Comment);
    commentTok.j = (this->tok).j;
    commentTok.kind = this_00->kind;
    commentTok.pos.line = (this_00->pos).line;
    commentTok._8_8_ = *(undefined8 *)&(this->tok).pos.col;
    pTVar6 = next_token(this);
    (this->tok).j = pTVar6->j;
    iVar4 = (pTVar6->pos).line;
    uVar3 = *(undefined8 *)&(pTVar6->pos).col;
    this_00->kind = pTVar6->kind;
    (this_00->pos).line = iVar4;
    *(undefined8 *)&(this->tok).pos.col = uVar3;
    TVar1 = (this->tok).kind;
    if (TVar1 == Identifier) {
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      pTVar6 = next_token(this);
      (this->tok).j = pTVar6->j;
      iVar4 = (pTVar6->pos).line;
      uVar3 = *(undefined8 *)&(pTVar6->pos).col;
      this_00->kind = pTVar6->kind;
      (this_00->pos).line = iVar4;
      *(undefined8 *)&(this->tok).pos.col = uVar3;
      bVar5 = Token::is_double_colon(this_00);
      if (bVar5) {
        std::__cxx11::string::append((char *)&type);
        pTVar6 = next_token(this);
        (this->tok).j = pTVar6->j;
        iVar4 = (pTVar6->pos).line;
        uVar3 = *(undefined8 *)&(pTVar6->pos).col;
        this_00->kind = pTVar6->kind;
        (this_00->pos).line = iVar4;
        *(undefined8 *)&(this->tok).pos.col = uVar3;
      }
      if (this_00->kind != Identifier) {
        error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
      }
      LexData::id_text_abi_cxx11_((string *)local_b8,this->data,this_00);
      std::__cxx11::string::append((string *)&type);
      std::__cxx11::string::~string((string *)local_b8);
      next_token(this);
      while (bVar5 = Token::is_double_colon(this_00), bVar5) {
        std::__cxx11::string::append((char *)&type);
        next_token(this);
        if (this_00->kind != Identifier) {
          error<char_const(&)[30]>(this,(char (*) [30])"expecting identifier after ::");
        }
        LexData::id_text_abi_cxx11_((string *)local_b8,this->data,this_00);
        std::__cxx11::string::append((string *)&type);
        std::__cxx11::string::~string((string *)local_b8);
        next_token(this);
      }
      do {
        TVar1 = this_00->kind;
        cVar7 = (char)&type;
        if (TVar1 == Punctuator) {
          if ((((this->tok).i - 0x26U & 0xfffffffb) != 0) || ((this->tok).j != 0))
          goto LAB_00107415;
          std::__cxx11::string::push_back(cVar7);
        }
        else {
          if (TVar1 == Eof) goto LAB_00107415;
          if ((TVar1 != Keyword) || ((this->tok).i != 0x11)) goto LAB_00107410;
          std::__cxx11::string::push_back(cVar7);
          std::__cxx11::string::append((string *)&type);
        }
        next_token(this);
      } while( true );
    }
    if (TVar1 == Keyword) break;
    if (TVar1 == Eof) {
      return;
    }
  }
  switch((this->tok).i) {
  case 3:
  case 4:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0x11:
  case 0x14:
  case 0x15:
  case 0x1b:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x34:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x40:
  case 0x42:
  case 0x46:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
    pTVar6 = next_token(this);
    id_tok.j = pTVar6->j;
    id_tok.kind = pTVar6->kind;
    id_tok.pos.line = (pTVar6->pos).line;
    id_tok._8_8_ = *(undefined8 *)&(pTVar6->pos).col;
    if ((this->tok).kind != Identifier) {
      error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
    }
    pLVar2 = this->data;
    LexData::id_text_abi_cxx11_(&type,pLVar2,&id_tok);
    make_section((DocSection *)local_b8,pLVar2,&commentTok,&type,
                 keywords_id_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
    std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
              (&doc->sections,(DocSection *)local_b8);
    break;
  default:
    goto switchD_0010722d_caseD_5;
  case 0xc:
  case 0x1e:
  case 0x2c:
  case 0x3e:
  case 0x49:
    pTVar6 = next_token(this);
    id_tok.j = pTVar6->j;
    id_tok.kind = pTVar6->kind;
    id_tok.pos.line = (pTVar6->pos).line;
    id_tok._8_8_ = *(undefined8 *)&(pTVar6->pos).col;
    if ((this->tok).kind != Identifier) {
      local_b8[0] = keywords_id_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(this->tok).i]._M_dataplus._M_p;
      error<char_const(&)[30],char_const*>
                (this,(char (*) [30])"expecting identifier after %s",(char **)local_b8);
      goto switchD_0010722d_caseD_5;
    }
    pLVar2 = this->data;
    LexData::id_text_abi_cxx11_(&type,pLVar2,&id_tok);
    make_section((DocSection *)local_b8,pLVar2,&commentTok,&type,
                 keywords_id_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
    std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
              (&doc->sections,(DocSection *)local_b8);
  }
  DocSection::~DocSection((DocSection *)local_b8);
  goto LAB_0010747c;
LAB_00107410:
  if (TVar1 != Identifier) {
LAB_00107415:
    local_b8[0] = type._M_dataplus._M_p;
    error<char_const(&)[35],char_const*>
              (this,(char (*) [35])"expecting identifier after type %s",(char **)local_b8);
  }
  LexData::id_text_abi_cxx11_((string *)&id_tok,this->data,this_00);
  make_section((DocSection *)local_b8,this->data,&commentTok,(string *)&id_tok,&type);
  std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
            (&doc->sections,(DocSection *)local_b8);
  DocSection::~DocSection((DocSection *)local_b8);
  std::__cxx11::string::~string((string *)&id_tok);
LAB_0010747c:
  std::__cxx11::string::~string((string *)&type);
  goto switchD_0010722d_caseD_5;
}

Assistant:

void createDoc(Doc& doc) {
    while (next_token().kind != TokenKind::Eof) {
      // Discard tokens until we find a comment, which might be
      // included in the docs.
      if (!is(TokenKind::Comment))
        continue;

      Token commentTok = tok;
      tok = next_token();
      if (eof()) // end of tokens (a comment at the end of file, maybe commenting the file?)
        break;

      switch (tok.kind) {
        case TokenKind::Keyword:
          switch (tok.i) {
            // Structures and namespaces
            case key_class:
            case key_struct:
            case key_enum:
            case key_union:
            case key_namespace: {
              Token idTok = next_token();
              if (!is(TokenKind::Identifier)) {
                error("expecting identifier after %s",
                      keywords_id[int(tok.i)].c_str());
                break;
              }

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(idTok),
                             keywords_id[int(tok.i)]));
              break;
            }
              // Variables or functions
            case key_auto:
            case key_bool:
            case key_char:
            case key_char16_t:
            case key_char32_t:
            case key_char8_t:
            case key_const:
            case key_constexpr:
            case key_constinit:
            case key_double:
            case key_explicit:
            case key_export:
            case key_extern:
            case key_float:
            case key_inline:
            case key_int:
            case key_long:
            case key_mutable:
            case key_register:
            case key_short:
            case key_signed:
            case key_static:
            case key_template:
            case key_thread_local:
            case key_typedef:
            case key_unsigned:
            case key_using:
            case key_virtual:
            case key_void:
            case key_volatile:
            case key_wchar_t: {
              Token id_tok = next_token();
              if (!is(TokenKind::Identifier))
                error("expecting identifier");

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(id_tok),
                             keywords_id[int(tok.i)]));
              break;
            }
          }
          break;
          // A user defined type to define a return value of a function or a variable type
        case TokenKind::Identifier: {
          Token firstTok = tok;
          std::string type;

          // TODO types that start with "const" go to the keyword
          //      case, or with "::" go to punctuator case

          tok = next_token();
          if (tok.is_double_colon()) {
            type += "::";
            tok = next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier");

          type += data.id_text(tok);
          next_token();

          while (tok.is_double_colon()) {
            type += "::";
            next_token();
            if (!is(TokenKind::Identifier))
              error("expecting identifier after ::");

            type += data.id_text(tok);
            next_token();
          }

          while (!eof() &&
                 // Pointers and references
                 ((is(TokenKind::Punctuator) &&
                   ((tok.i == '*' && tok.j == 0) ||
                    (tok.i == '&' && tok.j == 0)))
                  ||
                  // const
                  (tok.is_const_keyword()))) {
            if (is(TokenKind::Keyword)) {
              type.push_back(' ');
              type += keywords_id[tok.i];
            }
            else
              type.push_back(tok.i); // Add '*' or '&'
            next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier after type %s", type.c_str());

          std::string id(data.id_text(tok));

          doc.sections.push_back(
            make_section(data, commentTok, id, type));
          break;
        }
      }
    }
  }